

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_dwt_encode_1_real(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar2 = (ulong)(uint)sn;
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      uVar1 = 0xffffffff;
      if (0 < dn) {
        lVar7 = (long)(sn * 2 + -2);
        lVar8 = 2;
        uVar6 = 0;
        do {
          lVar11 = lVar8 + -2;
          if ((long)sn <= (long)uVar6) {
            lVar11 = lVar7;
          }
          uVar10 = uVar6 + 1;
          lVar5 = lVar7;
          if ((long)uVar10 < (long)sn) {
            lVar5 = lVar8;
          }
          lVar11 = ((long)a[lVar5] + (long)a[lVar11]) * 0x32c1 + 0x1000 >> 0xd;
          if (0x7fffffff < lVar11) goto LAB_0010b5b6;
          if (lVar11 < -0x80000000) goto LAB_0010b597;
          a[uVar6 * 2 + 1] = a[uVar6 * 2 + 1] - (int)lVar11;
          lVar8 = lVar8 + 2;
          uVar6 = uVar10;
        } while ((uint)dn != uVar10);
      }
      if (0 < sn) {
        lVar7 = (long)(dn * 2 + -1);
        lVar8 = 1;
        uVar6 = 0;
        uVar10 = 0xffffffff;
        do {
          piVar4 = a + 1;
          if ((uVar6 != 0) && (piVar4 = a + lVar7, (long)uVar6 <= (long)dn)) {
            piVar4 = a + (uVar10 & 0xffffffff);
          }
          lVar11 = lVar7;
          if ((long)uVar6 < (long)dn) {
            lVar11 = lVar8;
          }
          a[uVar6 * 2] = a[uVar6 * 2] -
                         (int)(((long)a[lVar11] + (long)*piVar4) * 0x1b2 + 0x1000U >> 0xd);
          uVar6 = uVar6 + 1;
          uVar10 = uVar10 + 2;
          lVar8 = lVar8 + 2;
        } while (uVar2 != uVar6);
      }
      if (0 < dn) {
        lVar7 = (long)(sn * 2 + -2);
        lVar8 = 2;
        uVar6 = 0;
        do {
          lVar11 = lVar8 + -2;
          if ((long)sn <= (long)uVar6) {
            lVar11 = lVar7;
          }
          uVar10 = uVar6 + 1;
          lVar5 = lVar7;
          if ((long)uVar10 < (long)sn) {
            lVar5 = lVar8;
          }
          a[uVar6 * 2 + 1] =
               a[uVar6 * 2 + 1] +
               (int)(((long)a[lVar5] + (long)a[lVar11]) * 0x1c41 + 0x1000U >> 0xd);
          lVar8 = lVar8 + 2;
          uVar6 = uVar10;
        } while ((uint)dn != uVar10);
      }
      if (0 < sn) {
        lVar7 = (long)(dn * 2 + -1);
        lVar8 = 1;
        uVar6 = 0;
        do {
          piVar4 = a + 1;
          if ((uVar6 != 0) && (piVar4 = a + lVar7, (long)uVar6 <= (long)dn)) {
            piVar4 = a + (uVar1 & 0xffffffff);
          }
          lVar11 = lVar7;
          if ((long)uVar6 < (long)dn) {
            lVar11 = lVar8;
          }
          a[uVar6 * 2] = a[uVar6 * 2] +
                         (int)(((long)a[lVar11] + (long)*piVar4) * 0xe31 + 0x1000U >> 0xd);
          uVar6 = uVar6 + 1;
          uVar1 = uVar1 + 2;
          lVar8 = lVar8 + 2;
        } while (uVar2 != uVar6);
      }
      if (0 < dn) {
        uVar2 = 0;
        do {
          a[uVar2 * 2 + 1] = (OPJ_INT32)((long)a[uVar2 * 2 + 1] * 0x13ae + 0x1000U >> 0xd);
          uVar2 = uVar2 + 1;
        } while ((uint)dn != uVar2);
      }
      if (0 < sn) {
        uVar2 = 0;
        do {
          a[uVar2 * 2] = (OPJ_INT32)((long)a[uVar2 * 2] * 0x1a03 + 0x1000U >> 0xd);
          uVar2 = uVar2 + 1;
        } while ((uint)sn != uVar2);
      }
    }
  }
  else if (1 < dn || 0 < sn) {
    uVar6 = 0xffffffff;
    lVar7 = (long)sn;
    uVar1 = (ulong)(uint)dn;
    if (0 < dn) {
      lVar8 = (long)(sn * 2 + -1);
      lVar11 = 1;
      uVar12 = 0;
      uVar10 = 0xffffffff;
      do {
        lVar5 = lVar8;
        if ((long)uVar12 < lVar7) {
          lVar5 = lVar11;
        }
        piVar4 = a + 1;
        if ((uVar12 != 0) && (piVar4 = a + lVar8, (long)uVar12 <= lVar7)) {
          piVar4 = a + (uVar10 & 0xffffffff);
        }
        lVar5 = ((long)*piVar4 + (long)a[lVar5]) * 0x32c1 + 0x1000 >> 0xd;
        if (0x7fffffff < lVar5) {
LAB_0010b5b6:
          __assert_fail("(temp >> 13) <= (OPJ_INT64)0x7FFFFFFF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                        ,0xfa,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
        }
        if (lVar5 < -0x80000000) {
LAB_0010b597:
          __assert_fail("(temp >> 13) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                        ,0xfb,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
        }
        a[uVar12 * 2] = a[uVar12 * 2] - (int)lVar5;
        uVar12 = uVar12 + 1;
        uVar10 = uVar10 + 2;
        lVar11 = lVar11 + 2;
      } while (uVar1 != uVar12);
    }
    lVar8 = (long)dn;
    if (0 < sn) {
      lVar5 = (long)(dn * 2 + -2);
      lVar11 = 2;
      uVar10 = 0;
      do {
        lVar3 = lVar11 + -2;
        if (lVar8 <= (long)uVar10) {
          lVar3 = lVar5;
        }
        uVar12 = uVar10 + 1;
        lVar9 = lVar5;
        if ((long)uVar12 < lVar8) {
          lVar9 = lVar11;
        }
        a[uVar10 * 2 + 1] =
             a[uVar10 * 2 + 1] - (int)(((long)a[lVar9] + (long)a[lVar3]) * 0x1b2 + 0x1000U >> 0xd);
        lVar11 = lVar11 + 2;
        uVar10 = uVar12;
      } while (uVar2 != uVar12);
    }
    if (0 < dn) {
      lVar11 = (long)(sn * 2 + -1);
      lVar5 = 1;
      uVar10 = 0;
      do {
        lVar3 = lVar11;
        if ((long)uVar10 < lVar7) {
          lVar3 = lVar5;
        }
        piVar4 = a + 1;
        if ((uVar10 != 0) && (piVar4 = a + lVar11, (long)uVar10 <= lVar7)) {
          piVar4 = a + (uVar6 & 0xffffffff);
        }
        a[uVar10 * 2] =
             a[uVar10 * 2] + (int)(((long)*piVar4 + (long)a[lVar3]) * 0x1c41 + 0x1000U >> 0xd);
        uVar10 = uVar10 + 1;
        uVar6 = uVar6 + 2;
        lVar5 = lVar5 + 2;
      } while (uVar1 != uVar10);
    }
    if (0 < sn) {
      lVar7 = (long)(dn * 2 + -2);
      lVar11 = 2;
      uVar6 = 0;
      do {
        lVar5 = lVar11 + -2;
        if (lVar8 <= (long)uVar6) {
          lVar5 = lVar7;
        }
        uVar10 = uVar6 + 1;
        lVar3 = lVar7;
        if ((long)uVar10 < lVar8) {
          lVar3 = lVar11;
        }
        a[uVar6 * 2 + 1] =
             a[uVar6 * 2 + 1] + (int)(((long)a[lVar3] + (long)a[lVar5]) * 0xe31 + 0x1000U >> 0xd);
        lVar11 = lVar11 + 2;
        uVar6 = uVar10;
      } while (uVar2 != uVar10);
    }
    if (0 < dn) {
      uVar6 = 0;
      do {
        a[uVar6 * 2] = (OPJ_INT32)((long)a[uVar6 * 2] * 0x13ae + 0x1000U >> 0xd);
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    if (0 < sn) {
      uVar1 = 0;
      do {
        a[uVar1 * 2 + 1] = (OPJ_INT32)((long)a[uVar1 * 2 + 1] * 0x1a03 + 0x1000U >> 0xd);
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1_real(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                                  OPJ_INT32 cas)
{
    OPJ_INT32 i;
    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_S_(i) + OPJ_S_(i + 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_D_(i - 1) + OPJ_D_(i), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 6659);    /*6660 */
            }
        }
    } else {
        if ((sn > 0) || (dn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 12993);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) -= opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 434);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) += opj_int_fix_mul(OPJ_DD_(i) + OPJ_DD_(i - 1), 7233);
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += opj_int_fix_mul(OPJ_SS_(i) + OPJ_SS_(i + 1), 3633);
            }
            for (i = 0; i < dn; i++) {
                OPJ_S(i) = opj_int_fix_mul(OPJ_S(i), 5038);    /*5038 */
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) = opj_int_fix_mul(OPJ_D(i), 6659);    /*6660 */
            }
        }
    }
}